

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::DeleteProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          JavascriptString *propertyNameString,PropertyOperationFlags propertyOperationFlags)

{
  Type *pTVar1;
  ScriptContext *this_00;
  JavascriptLibrary *pJVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  RecyclableObject *value;
  code *pcVar3;
  bool bVar4;
  PropertyTypes PVar5;
  ushort uVar6;
  unsigned_short uVar7;
  charcount_t cVar8;
  uint uVar9;
  PropertyId propertyId;
  char16 *pcVar10;
  undefined4 *puVar11;
  DictionaryPropertyDescriptor<unsigned_short> *this_02;
  byte bVar12;
  undefined1 local_70 [8];
  CharacterBuffer<char16_t> propertyName;
  
  pcVar10 = JavascriptString::GetString(propertyNameString);
  cVar8 = JavascriptString::GetLength(propertyNameString);
  bVar4 = PropertyRecord::IsPropertyNameNumeric(pcVar10,cVar8);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x3a3,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* "
                               );
    if (!bVar4) goto LAB_00da7432;
    *puVar11 = 0;
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  pJVar2 = (this_00->super_ScriptContextBase).javascriptLibrary;
  pcVar10 = JavascriptString::GetString(propertyNameString);
  cVar8 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)local_70);
  local_70 = (undefined1  [8])pcVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_70);
  this_01 = (this->propertyMap).ptr;
  propertyName.string.ptr._0_4_ = cVar8;
  uVar9 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_01,(CharacterBuffer<char16_t> *)local_70);
  if (-1 < (int)uVar9) {
    this_02 = (DictionaryPropertyDescriptor<unsigned_short> *)((this_01->entries).ptr + uVar9);
    PVar5 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
    if (((-1 < (char)PVar5) &&
        (bVar4 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyNameString), bVar4)
        ) && (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
             ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      Memory::Recycler::WBSetBit((char *)&propertyName.len);
      propertyName._8_8_ = &pJVar2->typesWithNoSpecialPropertyProtoChain;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&propertyName.len);
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
                ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyName._8_8_);
    }
    if (((this_02->flags & (UsedAsFixed|IsFixed)) != None) &&
       (((this_02->Attributes & 8) != 0 ||
        (((this_02->Data == 0xffff && (this_02->Getter == 0xffff)) && (this_02->Setter == 0xffff))))
       )) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x3b7,"(descriptor->SanityCheckFixedBits())",
                                  "descriptor->SanityCheckFixedBits()");
      if (!bVar4) goto LAB_00da7432;
      *puVar11 = 0;
    }
    bVar12 = this_02->Attributes;
    if ((bVar12 & 8) != 0) {
      return 1;
    }
    if ((bVar12 & 2) == 0) {
      pcVar10 = JavascriptString::GetString(propertyNameString);
      JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                (propertyOperationFlags,this_00,pcVar10);
      return 0;
    }
    value = (pJVar2->super_JavascriptLibraryBase).undefinedValue.ptr;
    if (((bVar12 & 0x10) != 0) && ((this_02->flags & IsShadowed) == None)) {
      return 0;
    }
    uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(this_02);
    if (uVar6 == 0xffff) {
      if ((this_02->flags & IsAccessor) == None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x3d1,"(descriptor->GetIsAccessor())",
                                    "descriptor->GetIsAccessor()");
        if (!bVar4) goto LAB_00da7432;
        *puVar11 = 0;
      }
      uVar7 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(this_02);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar7,value);
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(this_02);
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar6,value);
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      pcVar10 = JavascriptString::GetString(propertyNameString);
      cVar8 = JavascriptString::GetLength(propertyNameString);
      propertyId = ScriptContext::GetOrAddPropertyIdTracked(this_00,pcVar10,cVar8);
      ScriptContext::InvalidateProtoCaches(this_00,propertyId);
    }
    if ((this_02->Attributes & 0x10) == 0) {
      bVar12 = 0xe;
      if ((this_02->flags & IsShadowed) != None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x3dd,"(!descriptor->GetIsShadowed())",
                                    "!descriptor->GetIsShadowed()");
        if (!bVar4) {
LAB_00da7432:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar11 = 0;
      }
    }
    else {
      bVar12 = this_02->Attributes & 0xf0 | 0xe;
    }
    this_02->Attributes = bVar12;
    InvalidateFixedField<Js::JavascriptString*>(this,instance,propertyNameString,this_02);
    if ((char)((instance->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(instance);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,(CharacterBuffer<char16_t> *)local_70,
               (Var)0x0,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::DeleteProperty(DynamicObject *instance, JavascriptString *propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* ");

        ScriptContext* scriptContext = instance->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();
        DictionaryPropertyDescriptor<T>* descriptor;
        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());

        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            if (!this->GetHasSpecialProperties() && NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyNameString))
            {
                // If you are deleting a valueOf/toString and the flag wasn't set, it means you are deleting the default
                // implementation off of Object.prototype
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    library->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                return true;
            }
            else if (!(descriptor->Attributes & PropertyConfigurable))
            {
                // Let/const properties do not have attributes and they cannot be deleted
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, propertyNameString->GetString());

                return false;
            }

            Var undefined = library->GetUndefined();

            if (descriptor->HasNonLetConstGlobal())
            {
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetSlotUnchecked(instance, dataSlot, undefined);
                }
                else
                {
                    Assert(descriptor->GetIsAccessor());
                    SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), undefined);
                    SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), undefined);
                }

                if (this->GetFlags() & IsPrototypeFlag)
                {
                    scriptContext->InvalidateProtoCaches(scriptContext->GetOrAddPropertyIdTracked(propertyNameString->GetString(), propertyNameString->GetLength()));
                }

                if ((descriptor->Attributes & PropertyLetConstGlobal) == 0)
                {
                    Assert(!descriptor->GetIsShadowed());
                    descriptor->Attributes = PropertyDeletedDefaults;
                }
                else
                {
                    descriptor->Attributes &= ~PropertyDynamicTypeDefaults;
                    descriptor->Attributes |= PropertyDeletedDefaults;
                }
#if ENABLE_FIXED_FIELDS
                InvalidateFixedField(instance, propertyNameString, descriptor);
#endif

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyName, nullptr, SideEffects_Any);
                return true;
            }

            Assert(descriptor->Attributes & PropertyLetConstGlobal);
            return false;
        }

        return true;
    }